

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  BuiltIn builtin;
  uint32_t uVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  SPIRType *pSVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  const_iterator cVar11;
  long *plVar12;
  undefined8 *puVar13;
  Dim DVar14;
  _Base_ptr p_Var15;
  char (*ts_1) [2];
  size_type *psVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Base_ptr p_Var18;
  byte bVar19;
  _Base_ptr p_Var20;
  byte bVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  byte bVar22;
  bool bVar23;
  string address_space;
  string local_d8;
  ID local_b8;
  byte local_b1;
  ulong local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  uint local_84;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  SPIRType *local_58;
  string local_50;
  
  pSVar6 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  pSVar7 = Compiler::get_variable_data_type((Compiler *)this,pSVar6);
  local_58 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
  uVar5 = (pSVar6->super_IVariant).self.id;
  local_b8.id = (pSVar6->basevariable).id;
  if (local_b8.id == 0) {
    local_b8.id = uVar5;
  }
  bVar22 = arg->alias_global_variable;
  if ((bool)bVar22 == false) {
    local_b8.id = uVar5;
  }
  iVar4 = *(int *)&(pSVar7->super_IVariant).field_0xc;
  DVar14 = (pSVar7->image).dim;
  local_b0 = (ulong)local_58->storage;
  local_b1 = local_58->pointer;
  bVar19 = arg->write_count == 0 & local_b1 &
           ~(((DVar14 == DimSubpassData && iVar4 == 0x10) && (this->msl_options).platform == iOS) &
             (this->msl_options).ios_use_framebuffer_fetch_subpasses | bVar22);
  local_84 = iVar4 - 0x10;
  bVar21 = local_84 < 3 | bVar19;
  if ((pSVar7->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    bVar21 = bVar19;
  }
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (bVar21 != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    bVar22 = arg->alias_global_variable;
    iVar4 = *(int *)&(pSVar7->super_IVariant).field_0xc;
    DVar14 = (pSVar7->image).dim;
  }
  bVar23 = false;
  if ((((bVar22 & 1) == 0) && (bVar23 = false, iVar4 == 0x11)) && (DVar14 == Dim2D)) {
    pSVar8 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (pSVar7->image).type.id);
    if (*(int *)&(pSVar8->super_IVariant).field_0xc - 0xcU < 3) {
      p_Var18 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = &p_Var1->_M_header;
      p_Var20 = &p_Var1->_M_header;
      if (p_Var18 != (_Base_ptr)0x0) {
        do {
          if (0x38 < (int)p_Var18[1]._M_color) {
            p_Var15 = p_Var18;
          }
          p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < 0x39];
        } while (p_Var18 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
           (p_Var20 = p_Var15, 0x39 < (int)p_Var15[1]._M_color)) {
          p_Var20 = &p_Var1->_M_header;
        }
      }
      bVar23 = (_Rb_tree_header *)p_Var20 != p_Var1;
    }
    else {
      bVar23 = false;
    }
  }
  pSVar8 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(pSVar6->super_IVariant).field_0xc);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  get_type_address_space_abi_cxx11_(&local_80,this,pSVar8,(pSVar6->super_IVariant).self.id,true);
  bVar2 = Compiler::is_builtin_variable((Compiler *)this,pSVar6);
  this->is_using_builtin_array = bVar2;
  iVar4 = ::std::__cxx11::string::compare((char *)&local_80);
  if (iVar4 == 0) {
    this->is_using_builtin_array = true;
  }
  uVar5 = (pSVar6->basevariable).id;
  if ((uVar5 == 0) ||
     ((uVar5 != (this->stage_in_ptr_var_id).id && (uVar5 != (this->stage_out_ptr_var_id).id)))) {
    if (!bVar2) {
      if ((((int)local_b0 == 0xc) || ((int)local_b0 == 2)) &&
         (bVar3 = Compiler::is_array((Compiler *)this,pSVar7), bVar3)) {
        this->is_using_builtin_array = true;
        ts_1 = (char (*) [2])(ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_a8,this,pSVar7);
        join<std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e5e0e,
                   ts_1);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        paVar9 = &local_98;
        goto LAB_0026f19c;
      }
      if (!bVar23) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_d8,this,pSVar7,(ulong)(arg->id).id);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
        goto LAB_0026f197;
      }
      pSVar8 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (pSVar7->image).type.id);
      ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->super_CompilerGLSL).super_Compiler._vptr_Compiler;
      (**(code **)((long)&ts_2[4].field_2 + 8))(&local_a8,this,pSVar8,0);
      join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                (&local_d8,(spirv_cross *)"spvDynamicImageSampler<",(char (*) [24])&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e5ac1,
                 (char (*) [2])ts_2);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      Compiler::set_extended_decoration
                ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
      goto LAB_0026f1aa;
    }
    builtin = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
    builtin_type_decl_abi_cxx11_(&local_d8,this,builtin,(arg->id).id);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    bVar23 = (int)local_b0 == 0;
LAB_0026f25d:
    bVar2 = Compiler::is_array((Compiler *)this,pSVar7);
    if ((local_84 < 3) || (!bVar2)) {
      if (bVar23) {
        if (local_80._M_string_length != 0) {
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                    (&local_d8,(spirv_cross *)&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                     (char (*) [2])__return_storage_ptr__,ts_2);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true)
        ;
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      }
      else {
        if (local_80._M_string_length != 0) {
          if ((__return_storage_ptr__->_M_dataplus)._M_p
              [__return_storage_ptr__->_M_string_length - 1] == '*') {
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                      (&local_d8,(spirv_cross *)0x2e06c1,(char (*) [2])&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1
                       ,(char (*) [2])ts_2);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
          }
          else {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&local_d8,(spirv_cross *)&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1
                       ,(char (*) [2])__return_storage_ptr__,ts_2);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_restrict(this,local_b8.id,true);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true)
        ;
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      }
LAB_0026f614:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0026f627;
    }
    else {
      if (local_80._M_string_length != 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_d8,(spirv_cross *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                   (char (*) [2])__return_storage_ptr__,ts_2);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
      }
      if ((this->msl_options).argument_buffers == true) {
        uVar5 = Compiler::get_decoration((Compiler *)this,local_b8,DecorationDescriptorSet);
        if (((((int)local_b0 == 0xc) || ((int)local_b0 == 2)) && (uVar5 < 8)) &&
           (((this->msl_options).argument_buffers != false &&
            ((this->argument_buffer_discrete_mask >> (uVar5 & 0x1f) & 1) == 0)))) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar10 = to_restrict(this,local_b8.id,true);
      if (*pcVar10 != '\0') {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_d8,this,pSVar7);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0026f627;
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (&local_d8,this,pSVar7,(ulong)(arg->id).id);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
LAB_0026f197:
    paVar9 = &local_d8.field_2;
LAB_0026f19c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar9->_M_allocated_capacity)[-2] != paVar9) {
      operator_delete((undefined1 *)(&paVar9->_M_allocated_capacity)[-2]);
    }
LAB_0026f1aa:
    bVar23 = (int)local_b0 == 0;
    if (((bVar2 || bVar23) || ((local_b1 & 1) != 0)) || ((int)local_b0 - 9U < 0xfffffffe))
    goto LAB_0026f25d;
    if (((this->msl_options).force_native_arrays != true) ||
       (bVar23 = Compiler::is_array((Compiler *)this,pSVar7), !bVar23)) {
      if (local_80._M_string_length != 0) {
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  (&local_d8,(spirv_cross *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e06c1,
                   (char (*) [2])__return_storage_ptr__,ts_2);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_0026f614;
    }
    local_a8 = &local_98;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"thread const ","");
    plVar12 = (long *)::std::__cxx11::string::_M_append
                                ((char *)&local_a8,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p
                                );
    paVar9 = &local_d8.field_2;
    psVar16 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_d8.field_2._M_allocated_capacity = *psVar16;
      local_d8.field_2._8_8_ = plVar12[3];
      local_d8._M_dataplus._M_p = (pointer)paVar9;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar16;
      local_d8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_d8._M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar9) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar10 = to_restrict(this,local_b8.id,true);
    if (*pcVar10 != '\0') {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    CompilerGLSL::to_expression_abi_cxx11_(&local_d8,&this->super_CompilerGLSL,local_b8.id,true);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar9) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_d8,this,pSVar7);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar9) goto LAB_0026f627;
  }
  operator_delete(local_d8._M_dataplus._M_p);
LAB_0026f627:
  pSVar6 = Compiler::maybe_get_backing_variable((Compiler *)this,local_b8.id);
  if (pSVar6 != (SPIRVariable *)0x0) {
    local_d8._M_dataplus._M_p._0_4_ = (pSVar6->super_IVariant).self.id;
    cVar11 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->atomic_image_vars)._M_h,(key_type *)&local_d8);
    if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      pSVar7 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + (local_58->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_a8,this,pSVar7,0);
      plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x2f19de);
      paVar9 = &local_d8.field_2;
      psVar16 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_d8.field_2._M_allocated_capacity = *psVar16;
        local_d8.field_2._8_8_ = plVar12[3];
        local_d8._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar16;
        local_d8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_d8._M_string_length = plVar12[1];
      *plVar12 = (long)psVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar9) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_b8.id,true);
      plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2f3a0c);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar17) {
        local_98._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_98._8_8_ = plVar12[3];
        local_a8 = &local_98;
      }
      else {
        local_98._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar12;
      }
      local_a0 = plVar12[1];
      *plVar12 = (long)paVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)::std::__cxx11::string::append((char *)&local_a8);
      psVar16 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_d8.field_2._M_allocated_capacity = *psVar16;
        local_d8.field_2._8_8_ = puVar13[3];
        local_d8._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar16;
        local_d8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_d8._M_string_length = puVar13[1];
      *puVar13 = psVar16;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar9) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// Arrays of images/samplers in MSL are always const.
	if (!type.array.empty() && type_is_image)
		constref = true;

	string decl;
	if (constref)
		decl += "const ";

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = is_builtin_variable(var);
	is_using_builtin_array = builtin;
	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl += type_to_glsl(type, arg.id);
	else if (builtin)
		decl += builtin_type_decl(static_cast<BuiltIn>(get_decoration(arg.id, DecorationBuiltIn)), arg.id);
	else if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl += join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
		decl += type_to_glsl(type, arg.id);

	bool opaque_handle = storage == StorageClassUniformConstant;

	if (!builtin && !opaque_handle && !is_pointer &&
	    (storage == StorageClassFunction || storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of images and samplers are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		if (msl_options.argument_buffers)
		{
			uint32_t desc_set = get_decoration(name_id, DecorationDescriptorSet);
			if ((storage == StorageClassUniform || storage == StorageClassStorageBuffer) &&
			    descriptor_set_is_argument_buffer(desc_set))
			{
				// An awkward case where we need to emit *more* address space declarations (yay!).
				// An example is where we pass down an array of buffer pointers to leaf functions.
				// It's a constant array containing pointers to constants.
				// The pointer array is always constant however. E.g.
				// device SSBO * constant (&array)[N].
				// const device SSBO * constant (&array)[N].
				// constant SSBO * constant (&array)[N].
				// However, this only matters for argument buffers, since for MSL 1.0 style codegen,
				// we emit the buffer array on stack instead, and that seems to work just fine apparently.

				// If the argument was marked as being in device address space, any pointer to member would
				// be const device, not constant.
				if (argument_buffer_device_storage_mask & (1u << desc_set))
					decl += " const device";
				else
					decl += " constant";
			}
		}

		decl += " (&";
		const char *restrict_kw = to_restrict(name_id);
		if (*restrict_kw)
		{
			decl += " ";
			decl += restrict_kw;
		}
		decl += to_expression(name_id);
		decl += ")";
		decl += type_to_array_glsl(type);
	}
	else if (!opaque_handle)
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (decl.back() == '*')
				decl += join(" ", address_space, " ");
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id);
		decl += to_expression(name_id);
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}